

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall wasm::OptimizeInstructions::canonicalize(OptimizeInstructions *this,Binary *binary)

{
  undefined1 auVar1 [16];
  Id IVar2;
  Id IVar3;
  _func_int **pp_Var4;
  Expression *pEVar5;
  ulong uVar6;
  Expression *pEVar7;
  bool bVar8;
  BinaryOp BVar9;
  BinaryOp BVar10;
  int64_t iVar11;
  char *__function;
  undefined1 auVar12 [16];
  OptimizeInstructions *local_70;
  anon_class_16_2_3610dbfc swap;
  anon_class_24_3_4a829d37 maybeSwap;
  Binary *local_30;
  Binary *binary_local;
  
  local_30 = binary;
  bVar8 = shouldCanonicalize(this,binary);
  if (!bVar8) {
    __assert_fail("shouldCanonicalize(binary)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xa97,"void wasm::OptimizeInstructions::canonicalize(Binary *)");
  }
  maybeSwap.binary = (Binary **)&local_70;
  swap.this = (OptimizeInstructions *)&stack0xffffffffffffffd0;
  local_70 = this;
  swap.binary = (Binary **)this;
  maybeSwap.this = swap.this;
  if ((local_30->left->_id == ConstId) && (local_30->right->_id != ConstId)) {
    bVar8 = EffectAnalyzer::canReorder
                      (&((this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).super_Pass.runner)->options,
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).
                       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .
                       super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                       .currModule,local_30->left,local_30->right);
    if (!bVar8) {
      __assert_fail("canReorder(binary->left, binary->right)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0xa99,
                    "auto wasm::OptimizeInstructions::canonicalize(Binary *)::(anonymous class)::operator()() const"
                   );
    }
    bVar8 = Binary::isRelational
                      ((Binary *)
                       ((swap.this)->
                       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                       ).super_Pass._vptr_Pass);
    if (bVar8) {
      BVar9 = reverseRelationalOp(this,*(BinaryOp *)
                                        (((swap.this)->
                                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                         ).super_Pass._vptr_Pass + 2));
      *(BinaryOp *)
       (((swap.this)->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass._vptr_Pass + 2) = BVar9;
    }
    pp_Var4 = ((swap.this)->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
              ).super_Pass._vptr_Pass;
    auVar1 = *(undefined1 (*) [16])(pp_Var4 + 3);
    auVar12._0_8_ = auVar1._8_8_;
    auVar12._8_4_ = auVar1._0_4_;
    auVar12._12_4_ = auVar1._4_4_;
    *(undefined1 (*) [16])(pp_Var4 + 3) = auVar12;
  }
  pEVar5 = local_30->right;
  if (pEVar5->_id != ConstId) {
    pEVar5 = local_30->left;
    IVar2 = pEVar5->_id;
    if ((IVar2 != LocalGetId) || (local_30->right->_id == LocalGetId)) {
      pEVar7 = local_30->right;
      IVar3 = pEVar7->_id;
      if (IVar2 != IVar3) {
        if (IVar2 <= IVar3) {
          return;
        }
        goto LAB_009e555b;
      }
      if (IVar2 == BinaryId) {
        if (IVar3 != BinaryId) {
          __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
          goto LAB_009e5bb8;
        }
        if (*(int *)(pEVar7 + 1) < *(int *)(pEVar5 + 1)) goto LAB_009e555b;
      }
      else if (IVar2 == UnaryId) {
        if (IVar3 != UnaryId) {
          __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
          goto LAB_009e5bb8;
        }
        if (*(int *)(pEVar7 + 1) < *(int *)(pEVar5 + 1)) goto LAB_009e555b;
      }
      if (IVar2 != LocalGetId) {
        return;
      }
      if (IVar3 != LocalGetId) {
        __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
LAB_009e5bb8:
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                      ,0x31b,__function);
      }
      if (*(uint *)(pEVar5 + 1) <= *(uint *)(pEVar7 + 1)) {
        return;
      }
    }
LAB_009e555b:
    canonicalize::anon_class_24_3_4a829d37::operator()((anon_class_24_3_4a829d37 *)&swap.binary);
    return;
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) {
LAB_009e5b18:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  if (local_30->op == *(BinaryOp *)(&DAT_00e16570 + uVar6 * 4)) {
    Literal::neg((Literal *)&maybeSwap.swap,(Literal *)(pEVar5 + 1));
    Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
    Literal::~Literal((Literal *)&maybeSwap.swap);
    uVar6 = (pEVar5->type).id;
    if (uVar6 < 7) {
      local_30->op = *(BinaryOp *)(&DAT_00e1658c + uVar6 * 4);
      return;
    }
    goto LAB_009e5b18;
  }
  if (local_30->op == *(BinaryOp *)(&DAT_00e162e8 + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == -1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e162cc + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) goto LAB_009e5b18;
  if (local_30->op == *(BinaryOp *)(&DAT_00e162b0 + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == -1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e16294 + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) goto LAB_009e5b18;
  if (local_30->op == *(BinaryOp *)(&DAT_00e16294 + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == 1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e162b0 + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) goto LAB_009e5b18;
  if (local_30->op == *(BinaryOp *)(&DAT_00e162cc + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == 1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e162e8 + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) goto LAB_009e5b18;
  if (local_30->op == *(BinaryOp *)(&DAT_00e16304 + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == 1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e163e4 + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  uVar6 = (pEVar5->type).id;
  if (6 < uVar6) goto LAB_009e5b18;
  if (local_30->op == *(BinaryOp *)(&DAT_00e16320 + uVar6 * 4)) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == 1) {
      uVar6 = (pEVar5->type).id;
      if (6 < uVar6) goto LAB_009e5b18;
      local_30->op = *(BinaryOp *)(&DAT_00e163c8 + uVar6 * 4);
      Literal::makeZero((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  BVar9 = local_30->op;
  switch(BVar9) {
  case LtSInt32:
    if (*(long *)(pEVar5 + 2) != 2) goto LAB_009e5be1;
    if ((((Literal *)(pEVar5 + 1))->field_0).i32 == -0x7fffffff) {
      local_30->op = EqInt32;
      Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
    if ((int)BVar9 < 0x2a) {
LAB_009e5837:
      if (BVar9 == LeSInt32) goto switchD_009e57d0_caseD_13;
      if (BVar9 == GtSInt32) goto switchD_009e57d0_caseD_15;
      if (BVar9 == GeSInt32) goto switchD_009e57d0_caseD_17;
    }
    else {
      switch(BVar9) {
      case LtSInt64:
        goto switchD_009e56e9_caseD_2a;
      case LeSInt64:
        goto switchD_009e56e9_caseD_2c;
      case GtSInt64:
        goto switchD_009e56e9_caseD_2e;
      case GeSInt64:
        goto switchD_009e56e9_caseD_30;
      }
    }
    break;
  case LtUInt32:
  case LeUInt32:
  case GtUInt32:
    break;
  case LeSInt32:
    goto switchD_009e57d0_caseD_13;
  case GtSInt32:
switchD_009e57d0_caseD_15:
    if (*(long *)(pEVar5 + 2) != 2) goto LAB_009e5be1;
    if ((((Literal *)(pEVar5 + 1))->field_0).i32 == 0x7ffffffe) {
      local_30->op = EqInt32;
      Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
    if (BVar9 != LeSInt32) goto LAB_009e5961;
switchD_009e57d0_caseD_13:
    if (*(long *)(pEVar5 + 2) != 2) {
LAB_009e5be1:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    if ((((Literal *)(pEVar5 + 1))->field_0).i32 == 0x7ffffffe) {
      local_30->op = NeInt32;
      Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
    if (BVar9 == LeSInt64) {
switchD_009e56e9_caseD_2c:
      if (*(long *)(pEVar5 + 2) != 3) {
LAB_009e5bc2:
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x129,"int64_t wasm::Literal::geti64() const");
      }
      if ((((Literal *)(pEVar5 + 1))->field_0).i64 == 0x7ffffffffffffffe) {
        local_30->op = NeInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009e57ac;
      }
    }
    break;
  case GeSInt32:
switchD_009e57d0_caseD_17:
    if (*(long *)(pEVar5 + 2) != 2) goto LAB_009e5be1;
    if ((((Literal *)(pEVar5 + 1))->field_0).i32 == -0x7fffffff) {
      local_30->op = NeInt32;
      Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x2);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
    if (0x2b < (int)BVar9) goto LAB_009e589a;
LAB_009e5908:
    if (BVar9 == LeSInt32) goto switchD_009e57d0_caseD_13;
    if (BVar9 == GtSInt32) goto switchD_009e57d0_caseD_15;
    break;
  default:
    switch(BVar9) {
    case LtSInt64:
switchD_009e56e9_caseD_2a:
      if (*(long *)(pEVar5 + 2) != 3) goto LAB_009e5bc2;
      if ((((Literal *)(pEVar5 + 1))->field_0).i64 == -0x7fffffffffffffff) {
        local_30->op = EqInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009e57ac;
      }
      if ((int)BVar9 < 0x2c) goto LAB_009e5837;
LAB_009e589a:
      if (BVar9 == LeSInt64) goto switchD_009e56e9_caseD_2c;
      if (BVar9 == GtSInt64) goto switchD_009e56e9_caseD_2e;
      if (BVar9 == GeSInt64) goto switchD_009e56e9_caseD_30;
      break;
    case LeSInt64:
      goto switchD_009e56e9_caseD_2c;
    case GtSInt64:
switchD_009e56e9_caseD_2e:
      if (*(long *)(pEVar5 + 2) != 3) goto LAB_009e5bc2;
      if ((((Literal *)(pEVar5 + 1))->field_0).i64 == 0x7ffffffffffffffe) {
        local_30->op = EqInt64;
        Literal::makeSignedMax((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009e57ac;
      }
      if (BVar9 == LeSInt64) goto switchD_009e56e9_caseD_2c;
      if (BVar9 == LeSInt32) goto switchD_009e57d0_caseD_13;
      break;
    case GeSInt64:
switchD_009e56e9_caseD_30:
      if (*(long *)(pEVar5 + 2) != 3) goto LAB_009e5bc2;
      if ((((Literal *)(pEVar5 + 1))->field_0).i64 == -0x7fffffffffffffff) {
        local_30->op = NeInt64;
        Literal::makeSignedMin((Literal *)&maybeSwap.swap,(Type)0x3);
        Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
        goto LAB_009e57ac;
      }
      if ((int)BVar9 < 0x2c) goto LAB_009e5908;
LAB_009e5961:
      if (BVar9 == LeSInt64) goto switchD_009e56e9_caseD_2c;
      if (BVar9 == GtSInt64) goto switchD_009e56e9_caseD_2e;
    }
  }
  BVar10 = Abstract::getBinary((Type)(pEVar5->type).id,LeU);
  if (BVar9 == BVar10) {
    iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
    if (iVar11 == -2) {
      BVar9 = Abstract::getBinary((Type)(pEVar5->type).id,Ne);
      local_30->op = BVar9;
      Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
      Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
      goto LAB_009e57ac;
    }
  }
  BVar9 = local_30->op;
  BVar10 = Abstract::getBinary((Type)(pEVar5->type).id,GtU);
  if (BVar9 != BVar10) {
    return;
  }
  iVar11 = Literal::getInteger((Literal *)(pEVar5 + 1));
  if (iVar11 != -2) {
    return;
  }
  BVar9 = Abstract::getBinary((Type)(pEVar5->type).id,Eq);
  local_30->op = BVar9;
  Literal::makeUnsignedMax((Literal *)&maybeSwap.swap,(Type)(pEVar5->type).id);
  Literal::operator=((Literal *)(pEVar5 + 1),(Literal *)&maybeSwap.swap);
LAB_009e57ac:
  Literal::~Literal((Literal *)&maybeSwap.swap);
  return;
}

Assistant:

void canonicalize(Binary* binary) {
    assert(shouldCanonicalize(binary));
    auto swap = [&]() {
      assert(canReorder(binary->left, binary->right));
      if (binary->isRelational()) {
        binary->op = reverseRelationalOp(binary->op);
      }
      std::swap(binary->left, binary->right);
    };
    auto maybeSwap = [&]() {
      if (canReorder(binary->left, binary->right)) {
        swap();
      }
    };
    // Prefer a const on the right.
    if (binary->left->is<Const>() && !binary->right->is<Const>()) {
      swap();
    }
    if (auto* c = binary->right->dynCast<Const>()) {
      // x - C   ==>   x + (-C)
      // Prefer use addition if there is a constant on the right.
      if (binary->op == Abstract::getBinary(c->type, Abstract::Sub)) {
        c->value = c->value.neg();
        binary->op = Abstract::getBinary(c->type, Abstract::Add);
        return;
      }
      // Prefer to compare to 0 instead of to -1 or 1.
      // (signed)x > -1   ==>   x >= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x <= -1   ==>   x < 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeS) &&
          c->value.getInteger() == -1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x < 1   ==>   x <= 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::LeS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (signed)x >= 1   ==>   x > 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeS) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::GtS);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x < 1   ==>   x == 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::LtU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // (unsigned)x >= 1   ==>   x != 0
      if (binary->op == Abstract::getBinary(c->type, Abstract::GeU) &&
          c->value.getInteger() == 1LL) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeZero(c->type);
        return;
      }
      // Prefer compare to signed min (s_min) instead of s_min + 1.
      // (signed)x < s_min + 1   ==>   x == s_min
      if (binary->op == LtSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == LtSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // (signed)x >= s_min + 1   ==>   x != s_min
      if (binary->op == GeSInt32 && c->value.geti32() == INT32_MIN + 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMin(Type::i32);
        return;
      }
      if (binary->op == GeSInt64 && c->value.geti64() == INT64_MIN + 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMin(Type::i64);
        return;
      }
      // Prefer compare to signed max (s_max) instead of s_max - 1.
      // (signed)x > s_max - 1   ==>   x == s_max
      if (binary->op == GtSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = EqInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == GtSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = EqInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // (signed)x <= s_max - 1   ==>   x != s_max
      if (binary->op == LeSInt32 && c->value.geti32() == INT32_MAX - 1) {
        binary->op = NeInt32;
        c->value = Literal::makeSignedMax(Type::i32);
        return;
      }
      if (binary->op == LeSInt64 && c->value.geti64() == INT64_MAX - 1) {
        binary->op = NeInt64;
        c->value = Literal::makeSignedMax(Type::i64);
        return;
      }
      // Prefer compare to unsigned max (u_max) instead of u_max - 1.
      // (unsigned)x <= u_max - 1   ==>   x != u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::LeU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Ne);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      // (unsigned)x > u_max - 1   ==>   x == u_max
      if (binary->op == Abstract::getBinary(c->type, Abstract::GtU) &&
          c->value.getInteger() == (int64_t)(UINT64_MAX - 1)) {
        binary->op = Abstract::getBinary(c->type, Abstract::Eq);
        c->value = Literal::makeUnsignedMax(c->type);
        return;
      }
      return;
    }
    // Prefer a get on the right.
    if (binary->left->is<LocalGet>() && !binary->right->is<LocalGet>()) {
      return maybeSwap();
    }
    // Sort by the node id type, if different.
    if (binary->left->_id != binary->right->_id) {
      if (binary->left->_id > binary->right->_id) {
        return maybeSwap();
      }
      return;
    }
    // If the children have the same node id, we have to go deeper.
    if (auto* left = binary->left->dynCast<Unary>()) {
      auto* right = binary->right->cast<Unary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<Binary>()) {
      auto* right = binary->right->cast<Binary>();
      if (left->op > right->op) {
        return maybeSwap();
      }
    }
    if (auto* left = binary->left->dynCast<LocalGet>()) {
      auto* right = binary->right->cast<LocalGet>();
      if (left->index > right->index) {
        return maybeSwap();
      }
    }
  }